

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

QString * QMakeEvaluator::formatValueList
                    (QString *__return_storage_ptr__,ProStringList *vals,bool commas)

{
  long lVar1;
  ProString *str;
  ProString *val;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  val = (vals->super_QList<ProString>).d.ptr;
  for (lVar1 = (vals->super_QList<ProString>).d.size * 0x30; lVar1 != 0; lVar1 = lVar1 + -0x30) {
    if ((__return_storage_ptr__->d).size != 0) {
      if (commas) {
        QString::append((QChar)(char16_t)__return_storage_ptr__);
      }
      QString::append((QChar)(char16_t)__return_storage_ptr__);
    }
    formatValue((QString *)&local_50,val,false);
    QString::append((QString *)__return_storage_ptr__);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    val = val + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QMakeEvaluator::formatValueList(const ProStringList &vals, bool commas)
{
    QString ret;

    for (const ProString &str : vals) {
        if (!ret.isEmpty()) {
            if (commas)
                ret += QLatin1Char(',');
            ret += QLatin1Char(' ');
        }
        ret += formatValue(str);
    }
    return ret;
}